

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

void __thiscall SQLexer::LexBlockComment(SQLexer *this)

{
  LexChar LVar1;
  SQInteger SVar2;
  bool bVar3;
  
  bVar3 = false;
  do {
    LVar1 = this->_currdata;
    if (LVar1 == '\0') {
      (*this->_errfunc)(this->_errtarget,"missing \"*/\" in comment");
LAB_0011fcac:
      SVar2 = (*this->_readf)(this->_up);
      if (0xff < SVar2) {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
      }
      if (SVar2 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
      }
      else {
        this->_currdata = (LexChar)SVar2;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
    }
    else {
      if (LVar1 == '\n') {
        this->_currentline = this->_currentline + 1;
        goto LAB_0011fcac;
      }
      if (LVar1 != '*') goto LAB_0011fcac;
      SVar2 = (*this->_readf)(this->_up);
      if (0xff < SVar2) {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
      }
      if (SVar2 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
      }
      else {
        this->_currdata = (LexChar)SVar2;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata == '/') {
        SVar2 = (*this->_readf)(this->_up);
        if (0xff < SVar2) {
          (*this->_errfunc)(this->_errtarget,"Invalid character");
        }
        if (SVar2 == 0) {
          this->_currdata = '\0';
          this->_reached_eof = 1;
        }
        else {
          this->_currdata = (LexChar)SVar2;
        }
        this->_currentcolumn = this->_currentcolumn + 1;
        bVar3 = true;
      }
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void SQLexer::LexBlockComment()
{
    bool done = false;
    while(!done) {
        switch(CUR_CHAR) {
            case _SC('*'): { NEXT(); if(CUR_CHAR == _SC('/')) { done = true; NEXT(); }}; continue;
            case _SC('\n'): _currentline++; NEXT(); continue;
            case SQUIRREL_EOB: Error(_SC("missing \"*/\" in comment"));
            default: NEXT();
        }
    }
}